

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawInstancedTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_1::InstancedDrawInstance::prepareVertexData
          (InstancedDrawInstance *this,int instanceCount,int firstInstance)

{
  float fVar1;
  Vector<float,_4> local_264;
  int local_254;
  uint local_250;
  int i;
  uint local_248;
  uint local_244;
  uint local_240;
  uint local_23c;
  uint local_238;
  uint local_234;
  int ndx11;
  int ndx01;
  int ndx10;
  int ndx00;
  int x_2;
  int y_2;
  Vec4 local_218;
  Vector<float,_4> local_208;
  VertexPositionAndColor local_1f8;
  float local_1d8;
  float local_1d4;
  float fy;
  float fx;
  int x_1;
  int y_1;
  Vector<float,_4> local_1b4;
  VertexPositionAndColor local_1a4;
  deUint32 local_184;
  Vec4 local_180;
  Vector<float,_4> local_170;
  VertexPositionAndColor local_160;
  deUint32 local_140;
  Vec4 local_13c;
  Vector<float,_4> local_12c;
  VertexPositionAndColor local_11c;
  deUint32 local_fc;
  Vec4 local_f8;
  Vector<float,_4> local_e8;
  VertexPositionAndColor local_d8;
  deUint32 local_b8;
  Vec4 local_b4;
  Vector<float,_4> local_a4;
  VertexPositionAndColor local_94;
  deUint32 local_74;
  Vec4 local_70;
  Vector<float,_4> local_60;
  VertexPositionAndColor local_50;
  float local_30;
  float local_2c;
  float fy1;
  float fy0;
  float fx1;
  float fx0;
  int x;
  int y;
  int firstInstance_local;
  int instanceCount_local;
  InstancedDrawInstance *this_local;
  
  x = firstInstance;
  y = instanceCount;
  _firstInstance_local = this;
  std::
  vector<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor,_std::allocator<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>_>
  ::clear(&this->m_data);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_indexes);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::clear
            (&this->m_instancedColor);
  if (((this->m_params).function == FUNCTION_DRAW) ||
     ((this->m_params).function == FUNCTION_DRAW_INDIRECT)) {
    for (fx0 = 0.0; (int)fx0 < 8; fx0 = (float)((int)fx0 + 1)) {
      for (fx1 = 0.0; (int)fx1 < 8; fx1 = (float)((int)fx1 + 1)) {
        fy0 = (((float)(int)fx1 / 8.0) * 2.0) / (float)y + -1.0;
        fy1 = (((float)((int)fx1 + 1) / 8.0) * 2.0) / (float)y + -1.0;
        local_2c = (float)(int)fx0 / 8.0 + (float)(int)fx0 / 8.0 + -1.0;
        fVar1 = (float)((int)fx0 + 1) / 8.0;
        local_30 = fVar1 + fVar1 + -1.0;
        tcu::Vector<float,_4>::Vector(&local_60,fy0,local_2c,1.0,1.0);
        local_74 = (deUint32)tcu::RGBA::blue();
        tcu::RGBA::toVec((RGBA *)&local_70);
        VertexPositionAndColor::VertexPositionAndColor(&local_50,&local_60,&local_70);
        std::
        vector<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor,_std::allocator<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>_>
        ::push_back(&this->m_data,&local_50);
        tcu::Vector<float,_4>::Vector(&local_a4,fy1,local_2c,1.0,1.0);
        local_b8 = (deUint32)tcu::RGBA::blue();
        tcu::RGBA::toVec((RGBA *)&local_b4);
        VertexPositionAndColor::VertexPositionAndColor(&local_94,&local_a4,&local_b4);
        std::
        vector<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor,_std::allocator<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>_>
        ::push_back(&this->m_data,&local_94);
        tcu::Vector<float,_4>::Vector(&local_e8,fy0,local_30,1.0,1.0);
        local_fc = (deUint32)tcu::RGBA::green();
        tcu::RGBA::toVec((RGBA *)&local_f8);
        VertexPositionAndColor::VertexPositionAndColor(&local_d8,&local_e8,&local_f8);
        std::
        vector<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor,_std::allocator<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>_>
        ::push_back(&this->m_data,&local_d8);
        tcu::Vector<float,_4>::Vector(&local_12c,fy1,local_30,1.0,1.0);
        local_140 = (deUint32)tcu::RGBA::green();
        tcu::RGBA::toVec((RGBA *)&local_13c);
        VertexPositionAndColor::VertexPositionAndColor(&local_11c,&local_12c,&local_13c);
        std::
        vector<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor,_std::allocator<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>_>
        ::push_back(&this->m_data,&local_11c);
        tcu::Vector<float,_4>::Vector(&local_170,fy0,local_30,1.0,1.0);
        local_184 = (deUint32)tcu::RGBA::green();
        tcu::RGBA::toVec((RGBA *)&local_180);
        VertexPositionAndColor::VertexPositionAndColor(&local_160,&local_170,&local_180);
        std::
        vector<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor,_std::allocator<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>_>
        ::push_back(&this->m_data,&local_160);
        tcu::Vector<float,_4>::Vector(&local_1b4,fy1,local_2c,1.0,1.0);
        x_1 = (int)tcu::RGBA::blue();
        tcu::RGBA::toVec((RGBA *)&y_1);
        VertexPositionAndColor::VertexPositionAndColor(&local_1a4,&local_1b4,(Vec4 *)&y_1);
        std::
        vector<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor,_std::allocator<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>_>
        ::push_back(&this->m_data,&local_1a4);
      }
    }
  }
  else {
    for (fx = 0.0; (int)fx < 9; fx = (float)((int)fx + 1)) {
      for (fy = 0.0; (int)fy < 9; fy = (float)((int)fy + 1)) {
        local_1d4 = (((float)(int)fy / 8.0) * 2.0) / (float)y + -1.0;
        local_1d8 = (float)(int)fx / 8.0 + (float)(int)fx / 8.0 + -1.0;
        tcu::Vector<float,_4>::Vector(&local_208,local_1d4,local_1d8,1.0,1.0);
        if ((int)fx % 2 == 0) {
          x_2 = (int)tcu::RGBA::green();
          tcu::RGBA::toVec((RGBA *)&local_218);
        }
        else {
          y_2 = (int)tcu::RGBA::blue();
          tcu::RGBA::toVec((RGBA *)&local_218);
        }
        VertexPositionAndColor::VertexPositionAndColor(&local_1f8,&local_208,&local_218);
        std::
        vector<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor,_std::allocator<vkt::Draw::(anonymous_namespace)::VertexPositionAndColor>_>
        ::push_back(&this->m_data,&local_1f8);
      }
    }
    for (ndx00 = 0; ndx00 < 8; ndx00 = ndx00 + 1) {
      for (ndx10 = 0; ndx10 < 8; ndx10 = ndx10 + 1) {
        ndx01 = ndx00 * 9 + ndx10;
        ndx11 = ndx00 * 9 + ndx10 + 1;
        local_234 = (ndx00 + 1) * 9 + ndx10;
        local_238 = (ndx00 + 1) * 9 + ndx10 + 1;
        local_23c = ndx01 & 0xffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->m_indexes,&local_23c);
        local_240 = ndx11 & 0xffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->m_indexes,&local_240);
        local_244 = local_234 & 0xffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->m_indexes,&local_244);
        local_248 = local_238 & 0xffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->m_indexes,&local_248);
        i = local_234 & 0xffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->m_indexes,(value_type_conflict2 *)&i);
        local_250 = ndx11 & 0xffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->m_indexes,&local_250);
      }
    }
  }
  for (local_254 = 0; local_254 < y + x; local_254 = local_254 + 1) {
    tcu::Vector<float,_4>::Vector
              (&local_264,0.0,(1.0 - ((float)local_254 * 1.0) / (float)(y + x)) / 2.0,0.0,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (&this->m_instancedColor,&local_264);
  }
  return;
}

Assistant:

void InstancedDrawInstance::prepareVertexData(int instanceCount, int firstInstance)
{
	m_data.clear();
	m_indexes.clear();
	m_instancedColor.clear();

	if (m_params.function == TestParams::FUNCTION_DRAW || m_params.function == TestParams::FUNCTION_DRAW_INDIRECT)
	{
		for (int y = 0; y < QUAD_GRID_SIZE; y++)
		{
			for (int x = 0; x < QUAD_GRID_SIZE; x++)
			{
				const float fx0 = -1.0f + (float)(x+0) / (float)QUAD_GRID_SIZE * 2.0f / (float)instanceCount;
				const float fx1 = -1.0f + (float)(x+1) / (float)QUAD_GRID_SIZE * 2.0f / (float)instanceCount;
				const float fy0 = -1.0f + (float)(y+0) / (float)QUAD_GRID_SIZE * 2.0f;
				const float fy1 = -1.0f + (float)(y+1) / (float)QUAD_GRID_SIZE * 2.0f;

				// Vertices of a quad's lower-left triangle: (fx0, fy0), (fx1, fy0) and (fx0, fy1)
				m_data.push_back(VertexPositionAndColor(tcu::Vec4(fx0, fy0, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
				m_data.push_back(VertexPositionAndColor(tcu::Vec4(fx1, fy0, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
				m_data.push_back(VertexPositionAndColor(tcu::Vec4(fx0, fy1, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

				// Vertices of a quad's upper-right triangle: (fx1, fy1), (fx0, fy1) and (fx1, fy0)
				m_data.push_back(VertexPositionAndColor(tcu::Vec4(fx1, fy1, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
				m_data.push_back(VertexPositionAndColor(tcu::Vec4(fx0, fy1, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
				m_data.push_back(VertexPositionAndColor(tcu::Vec4(fx1, fy0, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
			}
		}
	}
	else
	{
		for (int y = 0; y < QUAD_GRID_SIZE + 1; y++)
		{
			for (int x = 0; x < QUAD_GRID_SIZE + 1; x++)
			{
				const float fx = -1.0f + (float)x / (float)QUAD_GRID_SIZE * 2.0f / (float)instanceCount;
				const float fy = -1.0f + (float)y / (float)QUAD_GRID_SIZE * 2.0f;

				m_data.push_back(VertexPositionAndColor(tcu::Vec4(fx, fy, 1.0f, 1.0f),
														(y % 2 ? tcu::RGBA::blue().toVec() : tcu::RGBA::green().toVec())));
			}
		}

		for (int y = 0; y < QUAD_GRID_SIZE; y++)
		{
			for (int x = 0; x < QUAD_GRID_SIZE; x++)
			{
				const int ndx00 = y*(QUAD_GRID_SIZE + 1) + x;
				const int ndx10 = y*(QUAD_GRID_SIZE + 1) + x + 1;
				const int ndx01 = (y + 1)*(QUAD_GRID_SIZE + 1) + x;
				const int ndx11 = (y + 1)*(QUAD_GRID_SIZE + 1) + x + 1;

				// Lower-left triangle of a quad.
				m_indexes.push_back((deUint16)ndx00);
				m_indexes.push_back((deUint16)ndx10);
				m_indexes.push_back((deUint16)ndx01);

				// Upper-right triangle of a quad.
				m_indexes.push_back((deUint16)ndx11);
				m_indexes.push_back((deUint16)ndx01);
				m_indexes.push_back((deUint16)ndx10);
			}
		}
	}

	for (int i = 0; i < instanceCount + firstInstance; i++)
	{
		m_instancedColor.push_back(tcu::Vec4(0.0, (float)(1.0 - i * 1.0 / (instanceCount + firstInstance)) / 2, 0.0, 1.0));
	}
}